

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall ON_Brep::SetTrimStartVertex(ON_Brep *this,int ti0,int vi)

{
  int iVar1;
  ON_BrepEdge *pOVar2;
  uint evi;
  bool bVar3;
  ulong uVar4;
  ON_BrepTrim *pOVar5;
  int iVar6;
  long lVar7;
  ON_BrepTrim *pOVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint local_48;
  uint local_44;
  int local_40;
  uint local_3c;
  ON_BrepTrim *local_38;
  
  uVar12 = 0;
  if ((vi | ti0) < 0) {
    return false;
  }
  local_3c = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count;
  local_48 = 0;
  uVar4 = (ulong)(uint)ti0;
  local_40 = vi;
LAB_00419801:
  uVar11 = local_48;
  iVar6 = (int)uVar4;
  if ((iVar6 < 0) || (0x1ff < uVar12)) goto LAB_0041997f;
  if ((uVar12 != 0) && ((iVar6 == ti0 && (local_48 == 0)))) {
    return true;
  }
  pOVar8 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
  if (pOVar8[uVar4].m_type == singular) {
    pOVar8[uVar4].m_vi[1] = local_40;
    pOVar8[uVar4].m_vi[0] = local_40;
    if (local_48 == 1) {
      local_44 = PrevTrim(this,iVar6);
    }
    else {
      local_44 = NextTrim(this,iVar6);
    }
    if ((uVar11 == 0) && (local_44 == ti0)) {
      return true;
    }
    local_48 = uVar11;
    if (pOVar8[(int)local_44].m_type != singular) {
      HopAcrossEdge(this,(int *)&local_44,(int *)&local_48);
    }
  }
  else {
    uVar10 = 1 - local_48;
    uVar9 = local_48;
    if (pOVar8[uVar4].m_bRev3d != false) {
      uVar9 = uVar10;
    }
    bVar3 = SetEdgeVertex(this,pOVar8[uVar4].m_ei,uVar9,local_40);
    if (!bVar3) {
      return false;
    }
    if (uVar11 == 0) {
      local_44 = PrevTrim(this,iVar6);
    }
    else {
      local_44 = NextTrim(this,iVar6);
    }
    if ((int)local_44 < 0) {
      return false;
    }
    pOVar8 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    local_48 = uVar10;
    if (pOVar8[local_44].m_type != singular) {
      iVar6 = pOVar8[local_44].m_ei;
      if ((long)iVar6 < 0) {
        return false;
      }
      if ((int)local_3c <= iVar6) {
        return false;
      }
      iVar1 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a
              [iVar6].m_ti.m_count;
      if (iVar1 < 1) goto LAB_0041997f;
      if (iVar1 == 1) {
        if (pOVar8[local_44].m_bRev3d != false) {
          uVar10 = uVar11;
        }
        SetEdgeVertex(this,iVar6,uVar10,local_40);
LAB_0041997f:
        local_48 = 0;
        pOVar8 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
        lVar13 = (long)ti0;
        local_44 = ti0;
        if (pOVar8[lVar13].m_type == singular) {
          uVar11 = 0;
          uVar12 = ti0;
          do {
            lVar7 = (long)(int)uVar12;
            uVar9 = uVar12;
            if (pOVar8[lVar7].m_type != singular) break;
            if (uVar12 != ti0) {
              pOVar8[lVar7].m_vi[0] = local_40;
              pOVar8[lVar7].m_vi[1] = local_40;
            }
            uVar12 = PrevTrim(this,uVar12);
            uVar11 = 1;
            lVar7 = lVar13;
            uVar9 = ti0;
          } while (uVar12 != ti0);
          uVar12 = pOVar8[lVar7].m_ei;
          if ((int)uVar12 < 0) {
            return true;
          }
          uVar10 = 1 - uVar11;
          if (pOVar8[lVar7].m_bRev3d == false) {
            uVar10 = uVar11;
          }
          local_48 = uVar11;
          local_44 = uVar9;
          SetEdgeVertex(this,uVar12,uVar10,local_40);
        }
        else {
          uVar12 = pOVar8[lVar13].m_ei;
          if ((int)uVar12 < 0) {
            return true;
          }
        }
        pOVar2 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
        if (pOVar2[uVar12].m_ti.m_count < 2) {
          return true;
        }
        bVar3 = HopAcrossEdge(this,(int *)&local_44,(int *)&local_48);
        uVar12 = local_48;
        if (!bVar3) {
          return false;
        }
        if (local_48 == 0) {
          local_44 = PrevTrim(this,local_44);
        }
        else {
          local_44 = NextTrim(this,local_44);
        }
        uVar4 = (ulong)local_44;
        if ((int)local_44 < 0) {
          return false;
        }
        uVar11 = 1 - uVar12;
        pOVar8 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
        local_48 = uVar11;
        if (pOVar8[uVar4].m_type != singular) {
          pOVar5 = pOVar8 + uVar4;
          iVar6 = pOVar5->m_ei;
          if ((long)iVar6 < 0) {
            return false;
          }
          if (pOVar2[iVar6].m_ti.m_count == 1) {
LAB_00419c5d:
            uVar9 = uVar11;
            if (pOVar5->m_bRev3d != false) {
              uVar9 = uVar12;
            }
            local_48 = uVar11;
            SetEdgeVertex(this,iVar6,uVar9,local_40);
            return true;
          }
          bVar3 = HopAcrossEdge(this,(int *)&local_44,(int *)&local_48);
          if (!bVar3) {
            return false;
          }
          uVar4 = (ulong)local_44;
        }
        uVar9 = local_48;
        uVar10 = 0;
        local_3c = (uint)uVar4;
        uVar14 = uVar4;
        do {
          uVar12 = local_48;
          iVar6 = (int)uVar14;
          if (iVar6 < 0) {
            return false;
          }
          if (0x1ff < uVar10) {
            return false;
          }
          uVar11 = local_48 ^ uVar9;
          if ((iVar6 == (int)uVar4 && uVar11 == 0) && uVar10 != 0) {
            return false;
          }
          if (pOVar8[uVar14].m_type == singular) {
            pOVar8[uVar14].m_vi[1] = local_40;
            pOVar8[uVar14].m_vi[0] = local_40;
            local_38 = pOVar8;
            if (local_48 == 1) {
              local_44 = PrevTrim(this,iVar6);
            }
            else {
              local_44 = NextTrim(this,iVar6);
            }
            uVar4 = (ulong)local_3c;
            if (local_44 == local_3c && uVar11 == 0) {
              return false;
            }
            pOVar8 = local_38;
            local_48 = uVar12;
            if (local_38[(int)local_44].m_type != singular) {
              HopAcrossEdge(this,(int *)&local_44,(int *)&local_48);
              uVar4 = (ulong)local_3c;
              pOVar8 = local_38;
            }
          }
          else {
            uVar11 = 1 - local_48;
            evi = local_48;
            if (pOVar8[uVar14].m_bRev3d != false) {
              evi = uVar11;
            }
            bVar3 = SetEdgeVertex(this,pOVar8[uVar14].m_ei,evi,local_40);
            if (!bVar3) {
              return false;
            }
            if (uVar12 == 0) {
              local_44 = PrevTrim(this,iVar6);
            }
            else {
              local_44 = NextTrim(this,iVar6);
            }
            uVar4 = (ulong)local_3c;
            if ((int)local_44 < 0) {
              return false;
            }
            pOVar8 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                     m_a;
            local_48 = uVar11;
            if (pOVar8[local_44].m_type != singular) {
              pOVar5 = pOVar8 + local_44;
              iVar6 = pOVar5->m_ei;
              if ((long)iVar6 < 0) {
                return false;
              }
              iVar1 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>
                      .m_a[iVar6].m_ti.m_count;
              if (iVar1 < 1) {
                return false;
              }
              if (iVar1 == 1) goto LAB_00419c5d;
              bVar3 = HopAcrossEdge(this,(int *)&local_44,(int *)&local_48);
              uVar4 = (ulong)local_3c;
              if (!bVar3) {
                return false;
              }
            }
          }
          uVar10 = uVar10 + 1;
          uVar14 = (ulong)local_44;
        } while( true );
      }
      bVar3 = HopAcrossEdge(this,(int *)&local_44,(int *)&local_48);
      if (!bVar3) {
        return false;
      }
    }
  }
  uVar12 = uVar12 + 1;
  uVar4 = (ulong)local_44;
  goto LAB_00419801;
}

Assistant:

bool ON_Brep::SetTrimStartVertex( const int ti0, const int vi )
{
  // Do not use NextEdge(), PrevEdge() because they require
  // the information we are in the act of creating.
  if ( ti0 < 0 || vi < 0 )
    return false;
  int next_ti, ti, ei, evi, tvi, counter;

  const int edge_count = m_E.Count();

  // Step counter clockwise around vertex until we hit a boundary
  // or we get back to where we started.
  for ( ti = ti0, tvi = 0, counter = 0; ti >= 0 && counter < 512; counter++ ) {
    if ( counter > 0 ) {
      if ( ti == ti0 && tvi == 0 )
        return true; // vertex was interior
    }
    ON_BrepTrim& trim = m_T[ti];
    if ( trim.m_type == ON_BrepTrim::singular ) {
      trim.m_vi[0] = trim.m_vi[1] = vi;
      tvi = 1-tvi;
      next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
      ti = next_ti;
      tvi = 1-tvi;
      if ( ti == ti0 && tvi == 0 )
        return true; // vertex was interior
      if ( m_T[ti].m_type != ON_BrepTrim::singular )
        HopAcrossEdge( ti, tvi ); // OK if hop fails because ti is a boundary
      continue;
    }

    ei = trim.m_ei;
    evi = (trim.m_bRev3d) ? 1-tvi : tvi;
    if ( !SetEdgeVertex( ei, evi, vi ) )
      return false;
    next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
    ti = next_ti;
    tvi = 1-tvi;
    if ( ti < 0 )
      return false; // should not happen

    if ( m_T[ti].m_type == ON_BrepTrim::singular )
      continue;
    ei = m_T[ti].m_ei;
    if ( ei < 0 || ei >= edge_count )
      return false; // should not happen
    evi = (m_T[ti].m_bRev3d) ? 1-tvi : tvi;
    const int edge_trim_count = m_E[ei].m_ti.Count();
    if ( edge_trim_count < 1 )
      break; // should not happen
    if ( edge_trim_count == 1 ) {
      SetEdgeVertex( ei, evi, vi );
      break; // ran into boundary
    }
    if ( !HopAcrossEdge( ti, tvi ) )
      return false;
  }


  // Get ready to step counter clockwise around vertex until
  // we hit a boundary.
  ti = ti0;
  tvi = 0;
  if ( m_T[ti].m_type == ON_BrepTrim::singular ) {
    // back up until we get to a non-singular trim
    while ( m_T[ti].m_type == ON_BrepTrim::singular ) {
      if ( ti != ti0 ) {
        m_T[ti].m_vi[0] = vi;
        m_T[ti].m_vi[1] = vi;
      }
      ti = PrevTrim(ti);
      tvi = 1;
      if ( ti == ti0 )
        break;
    }
    ei = m_T[ti].m_ei;
    if ( ei >= 0 ) {
      evi = (m_T[ti].m_bRev3d) ? 1-tvi : tvi;
      SetEdgeVertex( ei, evi, vi );
    }
  }
  else {
    ei = m_T[ti].m_ei;
  }
  if ( ei < 0 ) {
    // did the best we could - return true so setter keeps going
    // but the fact we are here means the brep is bogus.
    return true;
  }
  if ( m_E[ei].m_ti.Count() < 2 )
    return true; // ti0 is a boundary - we're done.
  if ( !HopAcrossEdge( ti, tvi ) )
    return false;
  next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
  if ( next_ti < 0 )
    return false;
  ti = next_ti;
  tvi = 1-tvi;
  if ( m_T[ti].m_type != ON_BrepTrim::singular ) {
    ei = m_T[ti].m_ei;
    if ( ei < 0 )
      return false;
    if ( m_E[ei].m_ti.Count() == 1 ) {
      evi = (m_T[ti].m_bRev3d)? 1-tvi : tvi;
      SetEdgeVertex( ei, evi, vi );
      return true;
    }
    if ( !HopAcrossEdge( ti, tvi ) )
      return false;
  }

  const int ti1 = ti;
  const int tvi1 = tvi;
  
  for ( ti = ti1, tvi = tvi1, counter = 0; ti >= 0 && counter < 512; counter++ ) {
    if ( counter > 0 ) {
      if ( ti == ti1 && tvi == tvi1 )
        return false; // vertex is not interior - so this should not happen
    }
    ON_BrepTrim& trim = m_T[ti];
    if ( trim.m_type == ON_BrepTrim::singular ) {
      trim.m_vi[0] = trim.m_vi[1] = vi;
      tvi = 1-tvi;
      next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
      ti = next_ti;
      tvi = 1-tvi;
      if ( ti == ti1 && tvi == tvi1 )
        return false; // vertex is not interior - so this should not happen
      if ( m_T[ti].m_type != ON_BrepTrim::singular )
        HopAcrossEdge( ti, tvi );  // OK if hop fails because ti is a boundary
      continue;
    }

    ei = trim.m_ei;
    evi = (trim.m_bRev3d) ? 1-tvi : tvi;
    if ( !SetEdgeVertex( ei, evi, vi ) )
      return false;
    next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
    ti = next_ti;
    tvi = 1-tvi;
    if ( ti < 0 )
      return false; // should not happen
    
    if ( m_T[ti].m_type == ON_BrepTrim::singular )
      continue;
    ei = m_T[ti].m_ei;
    if ( ei < 0 )
      return false; // should not happen
    evi = (m_T[ti].m_bRev3d) ? 1-tvi : tvi;
    const int edge_trim_count = m_E[ei].m_ti.Count();
    if ( edge_trim_count < 1 )
      break; // should not happen
    if ( edge_trim_count == 1 ) {
      SetEdgeVertex( ei, evi, vi );
      return true; // ran into boundary - expected
    }
    if ( !HopAcrossEdge( ti, tvi ) )
      return false;
  }

  return false; // should have exited by hitting "expected" boundary ~10 lines above
}